

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O0

void __thiscall
InvertDatabase::get_l2file(InvertDatabase *this,string *fname,char use_seq,int *l2cnt)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  runtime_error *prVar7;
  element_type *peVar8;
  __shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var9;
  element_type *peVar10;
  long lVar11;
  int local_28c;
  int local_288;
  int j;
  int i;
  char lflg;
  int lim;
  int *local_258;
  int *cntary;
  unsigned_long flen;
  long local_238;
  fstream file;
  int *l2cnt_local;
  char use_seq_local;
  string *fname_local;
  InvertDatabase *this_local;
  
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(&local_238,pcVar6,_S_bin);
  bVar2 = std::fstream::is_open();
  if ((bVar2 & 1) == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"can\'t open l2 file");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cntary = (int *)file_size((fstream *)&local_238);
  if (cntary != (int *)0x0) {
    local_258 = read_file((fstream *)&local_238,(unsigned_long)cntary);
    bVar2 = std::ios::operator!((void *)((long)&local_238 + *(long *)(local_238 + -0x18)));
    if ((bVar2 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lim,
                     "Error reading file ",fname);
      std::runtime_error::runtime_error(prVar7,(string *)&lim);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    uVar1 = (ulong)cntary / 4;
    for (local_288 = 0; local_288 < (int)uVar1; local_288 = local_288 + 3) {
      bVar3 = false;
      local_28c = 0;
      while( true ) {
        peVar8 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->cls);
        iVar4 = ClassInfo::get_num_class(peVar8);
        if (iVar4 <= local_28c) break;
        iVar4 = local_258[(long)local_288 + 2];
        peVar8 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->cls);
        iVar5 = ClassInfo::get_min_support(peVar8,local_28c);
        if (iVar5 <= iVar4) {
          bVar3 = true;
          break;
        }
        local_28c = local_28c + 1;
      }
      if (bVar3) {
        lVar11 = (long)local_288;
        bVar3 = extl2_pre_pruning(this,local_258[lVar11 + 2],local_258[lVar11 + 1],local_258[lVar11]
                                  ,use_seq,&vuint_null);
        if (!bVar3) {
          suffix_add_item_eqgraph(this,use_seq,local_258[local_288],local_258[(long)local_288 + 1]);
          *l2cnt = *l2cnt + 1;
          if (use_seq == '\0') {
            p_Var9 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::
                     vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ::operator[](&this->eqgraph,(long)local_258[(long)local_288 + 1]);
            peVar10 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(p_Var9);
            EqGrNode::add_sup(peVar10,local_258[(long)local_288 + 2],0);
          }
          else {
            p_Var9 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::
                     vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ::operator[](&this->eqgraph,(long)local_258[(long)local_288 + 1]);
            peVar10 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(p_Var9);
            EqGrNode::add_seqsup(peVar10,local_258[(long)local_288 + 2],0);
          }
          local_28c = 1;
          while( true ) {
            peVar8 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->cls);
            iVar4 = ClassInfo::get_num_class(peVar8);
            if (iVar4 <= local_28c) break;
            if (use_seq == '\0') {
              p_Var9 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::
                       vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                       ::operator[](&this->eqgraph,(long)local_258[(long)local_288 + 1]);
              peVar10 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var9);
              EqGrNode::add_sup(peVar10,0,local_28c);
            }
            else {
              p_Var9 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::
                       vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                       ::operator[](&this->eqgraph,(long)local_258[(long)local_288 + 1]);
              peVar10 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var9);
              EqGrNode::add_seqsup(peVar10,0,local_28c);
            }
            local_28c = local_28c + 1;
          }
        }
      }
    }
    if (local_258 != (int *)0x0) {
      operator_delete__(local_258);
    }
  }
  std::fstream::~fstream(&local_238);
  return;
}

Assistant:

void InvertDatabase::get_l2file(const string& fname, char use_seq, int &l2cnt) {
    fstream file(fname.c_str(), ios::binary);
    if (!file.is_open()) {
        throw runtime_error("can't open l2 file");
    }
    unsigned long flen = file_size(file);
    if (flen > 0) {
        int *cntary = read_file(file, flen);

        if (!file) {
            throw runtime_error("Error reading file " + fname);
        }
        file.close();

        // build eqgraph -- large 2-itemset relations
        int lim = flen / INT_SIZE;
        char lflg = 0;
        int i, j;
        for (i = 0; i < lim; i += 3) {
            lflg = 0;
            for (j = 0; j < cls->get_num_class(); j++) {
                if (cntary[i + 2] >= cls->get_min_support(j)) {
                    lflg = 1;
                    break;
                }
            }
            if (lflg) {
                if (!extl2_pre_pruning(cntary[i + 2], cntary[i + 1], cntary[i], use_seq, vuint_null)) {
                    suffix_add_item_eqgraph(use_seq, cntary[i], cntary[i + 1]);
                    l2cnt++;
                    //assign sup to a single class, sice we don't know breakup
                    if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(cntary[i + 2], 0);
                    else eqgraph[cntary[i + 1]]->add_sup(cntary[i + 2], 0);
                    for (j = 1; j < cls->get_num_class(); j++)
                        if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(0, j);
                        else eqgraph[cntary[i + 1]]->add_sup(0, j);
                }
            }
        }

        delete [] cntary;
    }
}